

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::ReshapeLayerParams::_internal_add_targetshape
          (ReshapeLayerParams *this,int64_t value)

{
  int64_t local_18;
  int64_t value_local;
  ReshapeLayerParams *this_local;
  
  local_18 = value;
  value_local = (int64_t)this;
  google::protobuf::RepeatedField<long>::Add(&this->targetshape_,&local_18);
  return;
}

Assistant:

inline void ReshapeLayerParams::_internal_add_targetshape(int64_t value) {
  targetshape_.Add(value);
}